

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGL3ExtensionHandler::extensionsLoaded(COpenGL3ExtensionHandler *this)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  undefined8 *puVar5;
  long *plVar6;
  const_iterator cVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_t j;
  _Hash_node_base *p_Var10;
  long lVar11;
  char cVar12;
  char *__end;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar14;
  string __str;
  key_type local_b8;
  COpenGL3ExtensionHandler *local_98;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  ulong *local_70;
  uint local_68;
  undefined4 uStack_64;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Loaded ","");
  uVar2 = (this->Extensions)._M_h._M_element_count;
  cVar12 = '\x01';
  if (9 < uVar2) {
    uVar8 = uVar2;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (uVar8 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001fa499;
      }
      if (uVar8 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001fa499;
      }
      if (uVar8 < 10000) goto LAB_001fa499;
      bVar3 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar3);
    cVar12 = cVar12 + '\x01';
  }
LAB_001fa499:
  local_98 = this;
  local_70 = local_60;
  ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar12);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar2);
  uVar2 = CONCAT44(uStack_64,local_68) + local_48;
  uVar8 = 0xf;
  if (local_50 != local_40) {
    uVar8 = local_40[0];
  }
  if (uVar8 < uVar2) {
    uVar8 = 0xf;
    if (local_70 != local_60) {
      uVar8 = local_60[0];
    }
    if (uVar2 <= uVar8) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_001fa521;
    }
  }
  puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
LAB_001fa521:
  local_90 = &local_80;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_80 = *plVar6;
    uStack_78 = puVar5[3];
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*puVar5;
  }
  local_88 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_90);
  paVar1 = &local_b8.field_2;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar9) {
    uVar13 = *(undefined4 *)paVar9;
    uVar14 = *(undefined4 *)((long)plVar6 + 0x14);
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b8.field_2._8_4_ = (undefined4)plVar6[3];
    local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    uVar13 = extraout_XMM0_Da;
    uVar14 = extraout_XMM0_Db;
    local_b8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b8._M_string_length = plVar6[1];
  *plVar6 = (long)paVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  os::Printer::log((Printer *)local_b8._M_dataplus._M_p,(double)CONCAT44(uVar14,uVar13));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  p_Var10 = (local_98->Extensions)._M_h._M_before_begin._M_nxt;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      local_90 = &local_80;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"  ","");
      plVar6 = (long *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)p_Var10[1]._M_nxt)
      ;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar9) {
        uVar13 = *(undefined4 *)paVar9;
        uVar14 = *(undefined4 *)((long)plVar6 + 0x14);
        local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_b8.field_2._8_4_ = (undefined4)plVar6[3];
        local_b8.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        uVar13 = extraout_XMM0_Da_00;
        uVar14 = extraout_XMM0_Db_00;
        local_b8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b8._M_string_length = plVar6[1];
      *plVar6 = (long)paVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      os::Printer::log((Printer *)local_b8._M_dataplus._M_p,(double)CONCAT44(uVar14,uVar13));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  this_00 = &local_98->Extensions;
  lVar11 = 0;
  do {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               (&COGLESCoreExtensionHandler::getFeatureString(unsigned_long)::OGLESFeatureStrings)
               [lVar11],(allocator<char> *)&local_90);
    cVar7 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this_00,&local_b8);
    (local_98->super_COGLESCoreExtensionHandler).FeatureAvailable[lVar11] =
         cVar7.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x1b);
  return;
}

Assistant:

void COpenGL3ExtensionHandler::extensionsLoaded()
{
	os::Printer::log((std::string("Loaded ") + std::to_string(Extensions.size()) + " extensions:").c_str(), ELL_DEBUG);
	for (const auto &it : Extensions)
		os::Printer::log((std::string("  ") + it).c_str(), ELL_DEBUG);
	for (size_t j = 0; j < IRR_OGLES_Feature_Count; ++j)
		FeatureAvailable[j] = queryExtension(getFeatureString(j));
}